

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O0

void __thiscall
vkt::texture::util::TextureRenderer::TextureRenderer
          (TextureRenderer *this,Context *context,VkSampleCountFlagBits sampleCount,
          deUint32 renderWidth,deUint32 renderHeight)

{
  deUint64 dVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_02;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_03;
  RefData<vk::Handle<(vk::HandleType)24>_> data_04;
  RefData<vk::Handle<(vk::HandleType)9>_> data_05;
  RefData<vk::Handle<(vk::HandleType)13>_> data_06;
  RefData<vk::Handle<(vk::HandleType)9>_> data_07;
  RefData<vk::Handle<(vk::HandleType)13>_> data_08;
  RefData<vk::Handle<(vk::HandleType)17>_> data_09;
  RefData<vk::Handle<(vk::HandleType)8>_> data_10;
  RefData<vk::Handle<(vk::HandleType)23>_> data_11;
  RefData<vk::Handle<(vk::HandleType)8>_> data_12;
  RefData<vk::Handle<(vk::HandleType)21>_> data_13;
  RefData<vk::Handle<(vk::HandleType)6>_> data_14;
  RefData<vk::Handle<(vk::HandleType)8>_> data_15;
  VkDevice pVVar2;
  VkDevice pVVar3;
  int iVar4;
  int iVar5;
  VkResult VVar6;
  TestContext *this_00;
  TestLog *pTVar7;
  TextureFormat TVar8;
  InstanceInterface *pIVar9;
  VkPhysicalDevice pVVar10;
  NotSupportedError *pNVar11;
  Handle<(vk::HandleType)9> *pHVar12;
  Allocation *pAVar13;
  VkDeviceSize VVar14;
  Handle<(vk::HandleType)8> *pHVar15;
  VkDeviceMemory VVar16;
  void *dst;
  Handle<(vk::HandleType)13> *pHVar17;
  Handle<(vk::HandleType)17> *pHVar18;
  MovePtr *pMVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  VkAttachmentReference *local_aa0;
  VkMemoryRequirements local_890;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_878;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_868;
  Move<vk::Handle<(vk::HandleType)8>_> local_858;
  RefData<vk::Handle<(vk::HandleType)8>_> local_838;
  undefined1 local_818 [8];
  VkBufferCreateInfo bufferCreateInfo_1;
  RefData<vk::Handle<(vk::HandleType)6>_> local_7c0;
  Move<vk::Handle<(vk::HandleType)21>_> local_7a0;
  RefData<vk::Handle<(vk::HandleType)21>_> local_780;
  undefined1 local_760 [8];
  DescriptorPoolBuilder descriptorPoolBuilder;
  VkMemoryRequirements local_728;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_710;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_700;
  Move<vk::Handle<(vk::HandleType)8>_> local_6f0;
  RefData<vk::Handle<(vk::HandleType)8>_> local_6d0;
  undefined1 local_6b0 [8];
  VkBufferCreateInfo bufferCreateInfo;
  RefData<vk::Handle<(vk::HandleType)23>_> local_658;
  undefined1 local_638 [8];
  VkFramebufferCreateInfo framebufferCreateInfo;
  VkImageView attachments [2];
  VkMemoryRequirements local_5c0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_5a8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_598;
  Move<vk::Handle<(vk::HandleType)8>_> local_588;
  RefData<vk::Handle<(vk::HandleType)8>_> local_568;
  undefined1 local_548 [8];
  VkBufferCreateInfo indexBufferParams;
  RefData<vk::Handle<(vk::HandleType)17>_> local_4f0;
  undefined1 local_4d0 [8];
  VkRenderPassCreateInfo renderPassCreateInfo;
  VkSubpassDescription subpassDesc;
  VkAttachmentReference resolveAttachmentRef;
  VkAttachmentReference attachmentRef;
  VkAttachmentDescription attachmentDesc [2];
  undefined1 local_3e8 [4];
  VkImageLayout imageLayout;
  RefData<vk::Handle<(vk::HandleType)13>_> local_3c8;
  undefined1 local_3a8 [8];
  VkImageViewCreateInfo imageViewCreateInfo_1;
  VkMemoryRequirements local_338;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_320;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_310;
  Move<vk::Handle<(vk::HandleType)9>_> local_300;
  RefData<vk::Handle<(vk::HandleType)9>_> local_2e0;
  undefined1 local_2c0 [8];
  VkImageCreateInfo imageCreateInfo_1;
  VkImageFormatProperties properties_1;
  undefined1 local_240 [4];
  VkImageUsageFlags imageUsage_1;
  RefData<vk::Handle<(vk::HandleType)13>_> local_220;
  undefined1 local_200 [8];
  VkImageViewCreateInfo imageViewCreateInfo;
  VkMemoryRequirements local_190;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_178;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_168;
  Move<vk::Handle<(vk::HandleType)9>_> local_158;
  RefData<vk::Handle<(vk::HandleType)9>_> local_138;
  undefined1 local_118 [8];
  VkImageCreateInfo imageCreateInfo;
  VkImageFormatProperties properties;
  undefined1 local_98 [4];
  VkImageUsageFlags imageUsage;
  RefData<vk::Handle<(vk::HandleType)24>_> local_78;
  MovePtr *local_58;
  Allocator *allocator;
  VkDevice pVStack_48;
  deUint32 queueFamilyIndex;
  VkDevice vkDevice;
  DeviceInterface *vkd;
  deUint32 local_24;
  deUint32 local_20;
  deUint32 renderHeight_local;
  deUint32 renderWidth_local;
  VkSampleCountFlagBits sampleCount_local;
  Context *context_local;
  TextureRenderer *this_local;
  
  this->m_context = context;
  local_24 = renderHeight;
  local_20 = renderWidth;
  renderHeight_local = sampleCount;
  _renderWidth_local = context;
  context_local = (Context *)this;
  this_00 = Context::getTestContext(context);
  pTVar7 = tcu::TestContext::getLog(this_00);
  this->m_log = pTVar7;
  this->m_renderWidth = local_20;
  this->m_renderHeight = local_24;
  this->m_sampleCount = renderHeight_local;
  this->m_multisampling = (uint)(this->m_sampleCount != VK_SAMPLE_COUNT_1_BIT);
  this->m_imageFormat = VK_FORMAT_R8G8B8A8_UNORM;
  TVar8 = ::vk::mapVkFormat(this->m_imageFormat);
  this->m_textureFormat = TVar8;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_image);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_imageMemory);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_imageView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_resolvedImage);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_resolvedImageMemory);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_resolvedImageView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move(&this->m_commandPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&this->m_frameBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_descriptorPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_uniformBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_uniformBufferMemory);
  this->m_uniformBufferSize = 0x30;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_vertexIndexBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_vertexIndexBufferMemory);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::Move(&this->m_fence);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_resultBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_resultBufferMemory);
  iVar4 = local_20 * local_24;
  iVar5 = tcu::TextureFormat::getPixelSize(&this->m_textureFormat);
  this->m_resultBufferSize = (ulong)(uint)(iVar4 * iVar5);
  std::
  vector<de::SharedPtr<vkt::texture::util::TextureBinding>,_std::allocator<de::SharedPtr<vkt::texture::util::TextureBinding>_>_>
  ::vector(&this->m_textureBindings);
  this->m_viewportOffsetX = 0.0;
  this->m_viewportOffsetY = 0.0;
  this->m_viewportWidth = (float)local_20;
  this->m_viewportHeight = (float)local_24;
  vkDevice = (VkDevice)Context::getDeviceInterface(this->m_context);
  pVStack_48 = Context::getDevice(this->m_context);
  allocator._4_4_ = Context::getUniversalQueueFamilyIndex(this->m_context);
  local_58 = (MovePtr *)Context::getDefaultAllocator(this->m_context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_98,(DeviceInterface *)vkDevice,
             pVStack_48,2,allocator._4_4_,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)local_98);
  data_04.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data_04.object.m_internal = local_78.object.m_internal;
  data_04.deleter.m_device = local_78.deleter.m_device;
  data_04.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=(&this->m_commandPool,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_98);
  pIVar9 = Context::getInstanceInterface(this->m_context);
  pVVar10 = Context::getPhysicalDevice(this->m_context);
  iVar4 = (*pIVar9->_vptr_InstanceInterface[4])
                    (pIVar9,pVVar10,(ulong)this->m_imageFormat,1,0,0x13,0,
                     &imageCreateInfo.initialLayout);
  if (iVar4 == -0xb) {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar11,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x1bf);
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if ((properties.maxMipLevels & this->m_sampleCount) != this->m_sampleCount) {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar11,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x1c4);
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  local_118._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageCreateInfo._4_4_ = 0;
  imageCreateInfo.pNext._0_4_ = 0;
  imageCreateInfo.pNext._4_4_ = 1;
  imageCreateInfo.flags = this->m_imageFormat;
  imageCreateInfo.imageType = this->m_renderWidth;
  imageCreateInfo.format = this->m_renderHeight;
  imageCreateInfo.extent.width = 1;
  imageCreateInfo.extent.height = 1;
  imageCreateInfo.extent.depth = 1;
  imageCreateInfo.mipLevels = this->m_sampleCount;
  imageCreateInfo.arrayLayers = 0;
  imageCreateInfo.samples = VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT;
  imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageCreateInfo.usage = 1;
  imageCreateInfo._64_8_ = (long)&allocator + 4;
  imageCreateInfo.pQueueFamilyIndices._0_4_ = 0;
  ::vk::createImage(&local_158,(DeviceInterface *)vkDevice,pVStack_48,(VkImageCreateInfo *)local_118
                    ,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&local_158);
  uVar20 = (undefined4)local_138.object.m_internal;
  uVar21 = (undefined4)(local_138.object.m_internal >> 0x20);
  data_05.deleter.m_deviceIface = local_138.deleter.m_deviceIface;
  data_05.object.m_internal = local_138.object.m_internal;
  data_05.deleter.m_device = local_138.deleter.m_device;
  data_05.deleter.m_allocator = local_138.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(&this->m_image,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_158);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_48;
  pMVar19 = local_58;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  ::vk::getImageMemoryRequirements
            (&local_190,(DeviceInterface *)pVVar3,pVVar2,(VkImage)pHVar12->m_internal);
  (*(*(_func_int ***)pMVar19)[3])(&local_178,pMVar19,&local_190,(ulong)::vk::MemoryRequirement::Any)
  ;
  local_168 = de::details::MovePtr::operator_cast_to_PtrData(&local_178,pMVar19);
  data.ptr._4_4_ = uVar21;
  data.ptr._0_4_ = uVar20;
  data._8_8_ = local_138.deleter.m_deviceIface;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&this->m_imageMemory,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_178);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_48;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  dVar1 = pHVar12->m_internal;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_imageMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  imageViewCreateInfo._72_8_ = ::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_imageMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar14 = ::vk::Allocation::getOffset(pAVar13);
  VVar6 = (**(code **)(*(long *)pVVar3 + 0x68))
                    (pVVar3,pVVar2,dVar1,imageViewCreateInfo._72_8_,VVar14);
  ::vk::checkResult(VVar6,
                    "vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                    ,0x1dd);
  local_200._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  imageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageViewCreateInfo._4_4_ = 0;
  imageViewCreateInfo.pNext._0_4_ = 0;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  imageViewCreateInfo._16_8_ = pHVar12->m_internal;
  imageViewCreateInfo.image.m_internal._0_4_ = 1;
  imageViewCreateInfo.image.m_internal._4_4_ = this->m_imageFormat;
  imageViewCreateInfo._32_16_ = ::vk::makeComponentMappingRGBA();
  imageViewCreateInfo.components.b = VK_COMPONENT_SWIZZLE_ZERO;
  imageViewCreateInfo.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  imageViewCreateInfo.subresourceRange.aspectMask = 1;
  imageViewCreateInfo.subresourceRange.baseMipLevel = 0;
  imageViewCreateInfo.subresourceRange.levelCount = 1;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_240,(DeviceInterface *)vkDevice,
             pVStack_48,(VkImageViewCreateInfo *)local_200,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_220,(Move *)local_240);
  data_06.deleter.m_deviceIface = local_220.deleter.m_deviceIface;
  data_06.object.m_internal = local_220.object.m_internal;
  data_06.deleter.m_device = local_220.deleter.m_device;
  data_06.deleter.m_allocator = local_220.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=(&this->m_imageView,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)local_240);
  if (this->m_multisampling != 0) {
    pIVar9 = Context::getInstanceInterface(this->m_context);
    pVVar10 = Context::getPhysicalDevice(this->m_context);
    iVar4 = (*pIVar9->_vptr_InstanceInterface[4])
                      (pIVar9,pVVar10,(ulong)this->m_imageFormat,1,0,0x13,0,
                       &imageCreateInfo_1.initialLayout);
    if (iVar4 == -0xb) {
      pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar11,"Format not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                 ,0x206);
      __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    local_2c0._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
    imageCreateInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    imageCreateInfo_1._4_4_ = 0;
    imageCreateInfo_1.pNext._0_4_ = 0;
    imageCreateInfo_1.pNext._4_4_ = 1;
    imageCreateInfo_1.flags = this->m_imageFormat;
    imageCreateInfo_1.imageType = this->m_renderWidth;
    imageCreateInfo_1.format = this->m_renderHeight;
    imageCreateInfo_1.extent.width = 1;
    imageCreateInfo_1.extent.height = 1;
    imageCreateInfo_1.extent.depth = 1;
    imageCreateInfo_1.mipLevels = 1;
    imageCreateInfo_1.arrayLayers = 0;
    imageCreateInfo_1.samples = VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT;
    imageCreateInfo_1.tiling = VK_IMAGE_TILING_OPTIMAL;
    imageCreateInfo_1.usage = 1;
    imageCreateInfo_1._64_8_ = (long)&allocator + 4;
    imageCreateInfo_1.pQueueFamilyIndices._0_4_ = 0;
    ::vk::createImage(&local_300,(DeviceInterface *)vkDevice,pVStack_48,
                      (VkImageCreateInfo *)local_2c0,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_2e0,(Move *)&local_300);
    uVar20 = (undefined4)local_2e0.object.m_internal;
    uVar21 = (undefined4)(local_2e0.object.m_internal >> 0x20);
    data_07.deleter.m_deviceIface = local_2e0.deleter.m_deviceIface;
    data_07.object.m_internal = local_2e0.object.m_internal;
    data_07.deleter.m_device = local_2e0.deleter.m_device;
    data_07.deleter.m_allocator = local_2e0.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=
              (&this->m_resolvedImage,data_07);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_300);
    pVVar3 = vkDevice;
    pVVar2 = pVStack_48;
    pMVar19 = local_58;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    ::vk::getImageMemoryRequirements
              (&local_338,(DeviceInterface *)pVVar3,pVVar2,(VkImage)pHVar12->m_internal);
    (*(*(_func_int ***)pMVar19)[3])
              (&local_320,pMVar19,&local_338,(ulong)::vk::MemoryRequirement::Any);
    local_310 = de::details::MovePtr::operator_cast_to_PtrData(&local_320,pMVar19);
    data_00.ptr._4_4_ = uVar21;
    data_00.ptr._0_4_ = uVar20;
    data_00._8_8_ = local_2e0.deleter.m_deviceIface;
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
              (&this->m_resolvedImageMemory,data_00);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_320);
    pVVar3 = vkDevice;
    pVVar2 = pVStack_48;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    dVar1 = pHVar12->m_internal;
    pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->(&(this->m_resolvedImageMemory).
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    imageViewCreateInfo_1._72_8_ = ::vk::Allocation::getMemory(pAVar13);
    pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->(&(this->m_resolvedImageMemory).
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    VVar14 = ::vk::Allocation::getOffset(pAVar13);
    VVar6 = (**(code **)(*(long *)pVVar3 + 0x68))
                      (pVVar3,pVVar2,dVar1,imageViewCreateInfo_1._72_8_,VVar14);
    ::vk::checkResult(VVar6,
                      "vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                      ,0x21e);
    local_3a8._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
    imageViewCreateInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    imageViewCreateInfo_1._4_4_ = 0;
    imageViewCreateInfo_1.pNext._0_4_ = 0;
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    imageViewCreateInfo_1._16_8_ = pHVar12->m_internal;
    imageViewCreateInfo_1.image.m_internal._0_4_ = 1;
    imageViewCreateInfo_1.image.m_internal._4_4_ = this->m_imageFormat;
    imageViewCreateInfo_1._32_16_ = ::vk::makeComponentMappingRGBA();
    imageViewCreateInfo_1.components.b = VK_COMPONENT_SWIZZLE_ZERO;
    imageViewCreateInfo_1.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
    imageViewCreateInfo_1.subresourceRange.aspectMask = 1;
    imageViewCreateInfo_1.subresourceRange.baseMipLevel = 0;
    imageViewCreateInfo_1.subresourceRange.levelCount = 1;
    ::vk::createImageView
              ((Move<vk::Handle<(vk::HandleType)13>_> *)local_3e8,(DeviceInterface *)vkDevice,
               pVStack_48,(VkImageViewCreateInfo *)local_3a8,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_3c8,(Move *)local_3e8);
    data_08.deleter.m_deviceIface = local_3c8.deleter.m_deviceIface;
    data_08.object.m_internal = local_3c8.object.m_internal;
    data_08.deleter.m_device = local_3c8.deleter.m_device;
    data_08.deleter.m_allocator = local_3c8.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
              (&this->m_resolvedImageView,data_08);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)13>_> *)local_3e8);
  }
  attachmentRef.attachment = 0;
  attachmentRef.layout = this->m_imageFormat;
  resolveAttachmentRef.attachment = 0;
  resolveAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  subpassDesc.pPreserveAttachments = (deUint32 *)0x200000001;
  renderPassCreateInfo.pDependencies._0_4_ = 0;
  renderPassCreateInfo.pDependencies._4_4_ = 0;
  subpassDesc.flags = 0;
  subpassDesc.inputAttachmentCount = 0;
  subpassDesc._12_4_ = 0;
  subpassDesc.pInputAttachments._0_4_ = 1;
  subpassDesc._24_8_ = &resolveAttachmentRef;
  if (this->m_multisampling == 0) {
    local_aa0 = (VkAttachmentReference *)0x0;
  }
  else {
    local_aa0 = (VkAttachmentReference *)&subpassDesc.pPreserveAttachments;
  }
  subpassDesc.pColorAttachments = local_aa0;
  subpassDesc.pResolveAttachments = (VkAttachmentReference *)0x0;
  subpassDesc.pDepthStencilAttachment._0_4_ = 0;
  subpassDesc.preserveAttachmentCount = 0;
  subpassDesc._60_4_ = 0;
  local_4d0._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.pNext._0_4_ = 0;
  renderPassCreateInfo.pNext._4_4_ = 2 - (uint)(this->m_multisampling == 0);
  renderPassCreateInfo._16_8_ = &attachmentRef;
  renderPassCreateInfo.pAttachments._0_4_ = 1;
  renderPassCreateInfo._32_8_ = &renderPassCreateInfo.pDependencies;
  renderPassCreateInfo.pSubpasses._0_4_ = 0;
  renderPassCreateInfo.dependencyCount = 0;
  renderPassCreateInfo._52_4_ = 0;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&indexBufferParams.pQueueFamilyIndices,
             (DeviceInterface *)vkDevice,pVStack_48,(VkRenderPassCreateInfo *)local_4d0,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_4f0,(Move *)&indexBufferParams.pQueueFamilyIndices);
  data_09.deleter.m_deviceIface = local_4f0.deleter.m_deviceIface;
  data_09.object.m_internal = local_4f0.object.m_internal;
  data_09.deleter.m_device = local_4f0.deleter.m_device;
  data_09.deleter.m_allocator = local_4f0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::operator=(&this->m_renderPass,data_09);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&indexBufferParams.pQueueFamilyIndices);
  local_548._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  indexBufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  indexBufferParams._4_4_ = 0;
  indexBufferParams.pNext._0_4_ = 0;
  indexBufferParams.flags = 0xc;
  indexBufferParams._20_4_ = 0;
  indexBufferParams.size._0_4_ = 0x40;
  indexBufferParams.size._4_4_ = 0;
  indexBufferParams.usage = 1;
  indexBufferParams._40_8_ = (long)&allocator + 4;
  ::vk::createBuffer(&local_588,(DeviceInterface *)vkDevice,pVStack_48,
                     (VkBufferCreateInfo *)local_548,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_568,(Move *)&local_588);
  uVar20 = (undefined4)local_568.object.m_internal;
  uVar21 = (undefined4)(local_568.object.m_internal >> 0x20);
  data_10.deleter.m_deviceIface = local_568.deleter.m_deviceIface;
  data_10.object.m_internal = local_568.object.m_internal;
  data_10.deleter.m_device = local_568.deleter.m_device;
  data_10.deleter.m_allocator = local_568.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            (&this->m_vertexIndexBuffer,data_10);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_588);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_48;
  pMVar19 = local_58;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      (&(this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  ::vk::getBufferMemoryRequirements
            (&local_5c0,(DeviceInterface *)pVVar3,pVVar2,(VkBuffer)pHVar15->m_internal);
  (*(*(_func_int ***)pMVar19)[3])
            (&local_5a8,pMVar19,&local_5c0,(ulong)::vk::MemoryRequirement::HostVisible);
  local_598 = de::details::MovePtr::operator_cast_to_PtrData(&local_5a8,pMVar19);
  data_01.ptr._4_4_ = uVar21;
  data_01.ptr._0_4_ = uVar20;
  data_01._8_8_ = local_568.deleter.m_deviceIface;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&this->m_vertexIndexBufferMemory,data_01);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_5a8);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_48;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      (&(this->m_vertexIndexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  dVar1 = pHVar15->m_internal;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexIndexBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar16 = ::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexIndexBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar14 = ::vk::Allocation::getOffset(pAVar13);
  VVar6 = (**(code **)(*(long *)pVVar3 + 0x60))(pVVar3,pVVar2,dVar1,VVar16.m_internal,VVar14);
  ::vk::checkResult(VVar6,
                    "vkd.bindBufferMemory(vkDevice, *m_vertexIndexBuffer, m_vertexIndexBufferMemory->getMemory(), m_vertexIndexBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                    ,0x291);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexIndexBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  dst = ::vk::Allocation::getHostPtr(pAVar13);
  ::deMemcpy(dst,s_vertexIndices,0xc);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_48;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexIndexBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar16 = ::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_vertexIndexBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar14 = ::vk::Allocation::getOffset(pAVar13);
  ::vk::flushMappedMemoryRange((DeviceInterface *)pVVar3,pVVar2,VVar16,VVar14,0xffffffffffffffff);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  framebufferCreateInfo._56_8_ = pHVar17->m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
            (&(this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  local_638._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  framebufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferCreateInfo._4_4_ = 0;
  framebufferCreateInfo.pNext._0_4_ = 0;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  framebufferCreateInfo._16_8_ = pHVar18->m_internal;
  framebufferCreateInfo.renderPass.m_internal._0_4_ = 2 - (uint)(this->m_multisampling == 0);
  framebufferCreateInfo._32_8_ = &framebufferCreateInfo.layers;
  framebufferCreateInfo.pAttachments._0_4_ = this->m_renderWidth;
  framebufferCreateInfo.pAttachments._4_4_ = this->m_renderHeight;
  framebufferCreateInfo.width = 1;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&bufferCreateInfo.pQueueFamilyIndices,
             (DeviceInterface *)vkDevice,pVStack_48,(VkFramebufferCreateInfo *)local_638,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_658,(Move *)&bufferCreateInfo.pQueueFamilyIndices);
  data_11.deleter.m_deviceIface = local_658.deleter.m_deviceIface;
  data_11.object.m_internal = local_658.object.m_internal;
  data_11.deleter.m_device = local_658.deleter.m_device;
  data_11.deleter.m_allocator = local_658.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=(&this->m_frameBuffer,data_11);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&bufferCreateInfo.pQueueFamilyIndices);
  local_6b0._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext._0_4_ = 0;
  bufferCreateInfo._16_8_ = this->m_uniformBufferSize;
  bufferCreateInfo.size._0_4_ = 0x10;
  bufferCreateInfo.size._4_4_ = 0;
  bufferCreateInfo.usage = 1;
  bufferCreateInfo._40_8_ = (long)&allocator + 4;
  ::vk::createBuffer(&local_6f0,(DeviceInterface *)vkDevice,pVStack_48,
                     (VkBufferCreateInfo *)local_6b0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_6d0,(Move *)&local_6f0);
  uVar20 = (undefined4)local_6d0.object.m_internal;
  uVar21 = (undefined4)(local_6d0.object.m_internal >> 0x20);
  data_12.deleter.m_deviceIface = local_6d0.deleter.m_deviceIface;
  data_12.object.m_internal = local_6d0.object.m_internal;
  data_12.deleter.m_device = local_6d0.deleter.m_device;
  data_12.deleter.m_allocator = local_6d0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_uniformBuffer,data_12);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_6f0);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_48;
  pMVar19 = local_58;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      (&(this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  ::vk::getBufferMemoryRequirements
            (&local_728,(DeviceInterface *)pVVar3,pVVar2,(VkBuffer)pHVar15->m_internal);
  (*(*(_func_int ***)pMVar19)[3])
            (&local_710,pMVar19,&local_728,(ulong)::vk::MemoryRequirement::HostVisible);
  local_700 = de::details::MovePtr::operator_cast_to_PtrData(&local_710,pMVar19);
  data_02.ptr._4_4_ = uVar21;
  data_02.ptr._0_4_ = uVar20;
  data_02._8_8_ = local_6d0.deleter.m_deviceIface;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&this->m_uniformBufferMemory,data_02);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_710);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_48;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      (&(this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  dVar1 = pHVar15->m_internal;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_uniformBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  descriptorPoolBuilder.m_counts.
  super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_uniformBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar14 = ::vk::Allocation::getOffset(pAVar13);
  VVar6 = (**(code **)(*(long *)pVVar3 + 0x60))
                    (pVVar3,pVVar2,dVar1,
                     descriptorPoolBuilder.m_counts.
                     super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,VVar14);
  ::vk::checkResult(VVar6,
                    "vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                    ,0x2c1);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_760);
  ::vk::DescriptorPoolBuilder::addType
            ((DescriptorPoolBuilder *)local_760,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
  ::vk::DescriptorPoolBuilder::addType
            ((DescriptorPoolBuilder *)local_760,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
  ::vk::DescriptorPoolBuilder::build
            (&local_7a0,(DescriptorPoolBuilder *)local_760,(DeviceInterface *)vkDevice,pVStack_48,1,
             2);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_780,(Move *)&local_7a0);
  data_13.deleter.m_deviceIface = local_780.deleter.m_deviceIface;
  data_13.object.m_internal = local_780.object.m_internal;
  data_13.deleter.m_device = local_780.deleter.m_device;
  data_13.deleter.m_allocator = local_780.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_13);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_7a0);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder((DescriptorPoolBuilder *)local_760);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&bufferCreateInfo_1.pQueueFamilyIndices,
                    (DeviceInterface *)vkDevice,pVStack_48,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_7c0,(Move *)&bufferCreateInfo_1.pQueueFamilyIndices);
  data_14.deleter.m_deviceIface = local_7c0.deleter.m_deviceIface;
  data_14.object.m_internal = local_7c0.object.m_internal;
  data_14.deleter.m_device = local_7c0.deleter.m_device;
  data_14.deleter.m_allocator = local_7c0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::operator=(&this->m_fence,data_14);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)&bufferCreateInfo_1.pQueueFamilyIndices);
  local_818._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo_1._4_4_ = 0;
  bufferCreateInfo_1.pNext._0_4_ = 0;
  bufferCreateInfo_1._16_8_ = this->m_resultBufferSize;
  bufferCreateInfo_1.size._0_4_ = 2;
  bufferCreateInfo_1.size._4_4_ = 0;
  bufferCreateInfo_1.usage = 1;
  bufferCreateInfo_1._40_8_ = (long)&allocator + 4;
  ::vk::createBuffer(&local_858,(DeviceInterface *)vkDevice,pVStack_48,
                     (VkBufferCreateInfo *)local_818,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_838,(Move *)&local_858);
  uVar20 = (undefined4)local_838.object.m_internal;
  uVar21 = (undefined4)(local_838.object.m_internal >> 0x20);
  data_15.deleter.m_deviceIface = local_838.deleter.m_deviceIface;
  data_15.object.m_internal = local_838.object.m_internal;
  data_15.deleter.m_device = local_838.deleter.m_device;
  data_15.deleter.m_allocator = local_838.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_resultBuffer,data_15);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_858);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_48;
  pMVar19 = local_58;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      (&(this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  ::vk::getBufferMemoryRequirements
            (&local_890,(DeviceInterface *)pVVar3,pVVar2,(VkBuffer)pHVar15->m_internal);
  (*(*(_func_int ***)pMVar19)[3])
            (&local_878,pMVar19,&local_890,(ulong)::vk::MemoryRequirement::HostVisible);
  local_868 = de::details::MovePtr::operator_cast_to_PtrData(&local_878,pMVar19);
  data_03.ptr._4_4_ = uVar21;
  data_03.ptr._0_4_ = uVar20;
  data_03._8_8_ = local_838.deleter.m_deviceIface;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&this->m_resultBufferMemory,data_03);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_878);
  pVVar3 = vkDevice;
  pVVar2 = pVStack_48;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      (&(this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  dVar1 = pHVar15->m_internal;
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_resultBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar16 = ::vk::Allocation::getMemory(pAVar13);
  pAVar13 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      (&(this->m_resultBufferMemory).
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar14 = ::vk::Allocation::getOffset(pAVar13);
  VVar6 = (**(code **)(*(long *)pVVar3 + 0x60))(pVVar3,pVVar2,dVar1,VVar16.m_internal,VVar14);
  ::vk::checkResult(VVar6,
                    "vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                    ,0x2e1);
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  clearImage(this,(VkImage)pHVar12->m_internal);
  if (this->m_multisampling != 0) {
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    clearImage(this,(VkImage)pHVar12->m_internal);
  }
  return;
}

Assistant:

TextureRenderer::TextureRenderer (Context& context, VkSampleCountFlagBits sampleCount, deUint32 renderWidth, deUint32 renderHeight)
	: m_context					(context)
	, m_log						(context.getTestContext().getLog())
	, m_renderWidth				(renderWidth)
	, m_renderHeight			(renderHeight)
	, m_sampleCount				(sampleCount)
	, m_multisampling			(m_sampleCount != VK_SAMPLE_COUNT_1_BIT)
	, m_imageFormat				(VK_FORMAT_R8G8B8A8_UNORM)
	, m_textureFormat			(vk::mapVkFormat(m_imageFormat))
	, m_uniformBufferSize		(sizeof(ShaderParameters))
	, m_resultBufferSize		(renderWidth * renderHeight * m_textureFormat.getPixelSize())
	, m_viewportOffsetX			(0.0f)
	, m_viewportOffsetY			(0.0f)
	, m_viewportWidth			((float)renderWidth)
	, m_viewportHeight			((float)renderHeight)
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();

	// Command Pool
	m_commandPool = createCommandPool(vkd, vkDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex);

	// Image
	{
		const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
		VkImageFormatProperties	properties;

		if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																					 m_imageFormat,
																					 VK_IMAGE_TYPE_2D,
																					 VK_IMAGE_TILING_OPTIMAL,
																					 imageUsage,
																					 0,
																					 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		if ((properties.sampleCounts & m_sampleCount) != m_sampleCount)
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		const VkImageCreateInfo					imageCreateInfo			=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
			m_imageFormat,								// VkFormat					format;
			{ m_renderWidth, m_renderHeight, 1u },		// VkExtent3D				extent;
			1u,											// deUint32					mipLevels;
			1u,											// deUint32					arrayLayers;
			m_sampleCount,								// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
			imageUsage,									// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
			1u,											// deUint32					queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
		};

		m_image = vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);

		m_imageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_image), MemoryRequirement::Any);
		VK_CHECK(vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset()));
	}

	// Image View
	{
		const VkImageViewCreateInfo				imageViewCreateInfo		=
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
			DE_NULL,									// const void*					pNext;
			0u,											// VkImageViewCreateFlags		flags;
			*m_image,									// VkImage						image;
			VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
			m_imageFormat,								// VkFormat						format;
			makeComponentMappingRGBA(),					// VkComponentMapping			components;
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
				0u,											// deUint32						baseMipLevel;
				1u,											// deUint32						mipLevels;
				0u,											// deUint32						baseArrayLayer;
				1u,											// deUint32						arraySize;
			},											// VkImageSubresourceRange		subresourceRange;
		};

		m_imageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
	}

	if (m_multisampling)
	{
		{
			// Resolved Image
			const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
			VkImageFormatProperties	properties;

			if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																						 m_imageFormat,
																						 VK_IMAGE_TYPE_2D,
																						 VK_IMAGE_TILING_OPTIMAL,
																						 imageUsage,
																						 0,
																						 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
			{
				TCU_THROW(NotSupportedError, "Format not supported");
			}

			const VkImageCreateInfo					imageCreateInfo			=
			{
				VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
				DE_NULL,									// const void*				pNext;
				0u,											// VkImageCreateFlags		flags;
				VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
				m_imageFormat,								// VkFormat					format;
				{ m_renderWidth, m_renderHeight, 1u },		// VkExtent3D				extent;
				1u,											// deUint32					mipLevels;
				1u,											// deUint32					arrayLayers;
				VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits	samples;
				VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
				imageUsage,									// VkImageUsageFlags		usage;
				VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
				1u,											// deUint32					queueFamilyIndexCount;
				&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
				VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
			};

			m_resolvedImage			= vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);
			m_resolvedImageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_resolvedImage), MemoryRequirement::Any);
			VK_CHECK(vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset()));
		}

		// Resolved Image View
		{
			const VkImageViewCreateInfo				imageViewCreateInfo		=
			{
				VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
				DE_NULL,									// const void*					pNext;
				0u,											// VkImageViewCreateFlags		flags;
				*m_resolvedImage,							// VkImage						image;
				VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
				m_imageFormat,								// VkFormat						format;
				makeComponentMappingRGBA(),					// VkComponentMapping			components;
				{
					VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
					0u,											// deUint32						baseMipLevel;
					1u,											// deUint32						mipLevels;
					0u,											// deUint32						baseArrayLayer;
					1u,											// deUint32						arraySize;
				},											// VkImageSubresourceRange		subresourceRange;
			};

			m_resolvedImageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
		}
	}

	// Render Pass
	{
		const VkImageLayout						imageLayout				= VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
		const VkAttachmentDescription			attachmentDesc[]		=
		{
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				m_sampleCount,										// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_LOAD,												// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			},
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			}
		};

		const VkAttachmentReference				attachmentRef			=
		{
			0u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkAttachmentReference				resolveAttachmentRef	=
		{
			1u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkSubpassDescription				subpassDesc				=
		{
			0u,													// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,					// VkPipelineBindPoint				pipelineBindPoint;
			0u,													// deUint32							inputAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pInputAttachments;
			1u,													// deUint32							colorAttachmentCount;
			&attachmentRef,										// const VkAttachmentReference*		pColorAttachments;
			m_multisampling ? &resolveAttachmentRef : DE_NULL,	// const VkAttachmentReference*		pResolveAttachments;
			DE_NULL,											// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,													// deUint32							preserveAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pPreserveAttachments;
		};

		const VkRenderPassCreateInfo			renderPassCreateInfo	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			0u,													// VkRenderPassCreateFlags			flags;
			m_multisampling ? 2u : 1u,							// deUint32							attachmentCount;
			attachmentDesc,										// const VkAttachmentDescription*	pAttachments;
			1u,													// deUint32							subpassCount;
			&subpassDesc,										// const VkSubpassDescription*		pSubpasses;
			0u,													// deUint32							dependencyCount;
			DE_NULL,											// const VkSubpassDependency*		pDependencies;
		};

		m_renderPass =  createRenderPass(vkd, vkDevice, &renderPassCreateInfo, DE_NULL);
	}

	// Vertex index buffer
	{
		const VkBufferCreateInfo			indexBufferParams		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			s_vertexIndexBufferSize,					// VkDeviceSize			size;
			VK_BUFFER_USAGE_INDEX_BUFFER_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_vertexIndexBuffer			= createBuffer(vkd, vkDevice, &indexBufferParams);
		m_vertexIndexBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_vertexIndexBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_vertexIndexBuffer, m_vertexIndexBufferMemory->getMemory(), m_vertexIndexBufferMemory->getOffset()));

		// Load vertices into vertex buffer
		deMemcpy(m_vertexIndexBufferMemory->getHostPtr(), s_vertexIndices, s_vertexIndexBufferSize);
		flushMappedMemoryRange(vkd, vkDevice, m_vertexIndexBufferMemory->getMemory(), m_vertexIndexBufferMemory->getOffset(), VK_WHOLE_SIZE);
	}

	// FrameBuffer
	{
		const VkImageView						attachments[]			=
		{
			*m_imageView,
			*m_resolvedImageView,
		};

		const VkFramebufferCreateInfo			framebufferCreateInfo	=
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,	// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkFramebufferCreateFlags	flags;
			*m_renderPass,								// VkRenderPass				renderPass;
			m_multisampling ? 2u : 1u,					// deUint32					attachmentCount;
			attachments,								// const VkImageView*		pAttachments;
			m_renderWidth,								// deUint32					width;
			m_renderHeight,								// deUint32					height;
			1u,											// deUint32					layers;
		};

		m_frameBuffer = createFramebuffer(vkd, vkDevice, &framebufferCreateInfo, DE_NULL);
	}

	// Uniform Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_uniformBufferSize,						// VkDeviceSize			size;
			VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_uniformBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_uniformBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_uniformBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset()));
	}

	// DescriptorPool
	{
		DescriptorPoolBuilder					descriptorPoolBuilder;

		descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER);
		descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER);
		m_descriptorPool = descriptorPoolBuilder.build(vkd, vkDevice, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 2u);
	}

	// Fence
	m_fence = createFence(vkd, vkDevice);

	// Result Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_resultBufferSize,							// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_resultBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_resultBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_resultBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset()));
	}

	clearImage(*m_image);
	if(m_multisampling)
		clearImage(*m_resolvedImage);
}